

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O1

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::pushNode(OpenGEXImporter *this,aiNode *node,aiScene *pScene)

{
  _Rb_tree_header *p_Var1;
  pointer *pppaVar2;
  pointer ppaVar3;
  aiNode *paVar4;
  ChildInfo *__ptr;
  iterator __position;
  _Base_ptr p_Var5;
  default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo> *this_00;
  _List_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr local_30;
  aiNode *local_28;
  
  local_28 = node;
  if (pScene == (aiScene *)0x0) {
    __assert_fail("nullptr != pScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                  ,0x4ed,"void Assimp::OpenGEX::OpenGEXImporter::pushNode(aiNode *, aiScene *)");
  }
  if (node == (aiNode *)0x0) {
    return;
  }
  ppaVar3 = (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppaVar3) {
    paVar4 = pScene->mRootNode;
    node->mParent = paVar4;
    p_Var1 = &(this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(aiNode **)(p_Var5 + 1) < paVar4])
    {
      if (*(aiNode **)(p_Var5 + 1) >= paVar4) {
        p_Var7 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
       (p_Var5 = p_Var7, paVar4 < *(aiNode **)(p_Var7 + 1))) {
      p_Var5 = &p_Var1->_M_header;
    }
    if (p_Var1 == (_Rb_tree_header *)p_Var5) {
      p_Var5 = (_Base_ptr)operator_new(0x18);
      p_Var5->_M_parent = p_Var5;
      *(_Base_ptr *)p_Var5 = p_Var5;
      p_Var5->_M_left = (_Base_ptr)0x0;
      this->m_root = (ChildInfo *)p_Var5;
      local_30 = p_Var5;
      this_00 = (default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo> *)
                std::
                map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
                ::operator[](&this->m_nodeChildMap,&node->mParent);
      goto LAB_0047d84c;
    }
  }
  else {
    paVar4 = ppaVar3[-1];
    if (paVar4 == (aiNode *)0x0) {
      __assert_fail("nullptr != parent",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                    ,0x501,"void Assimp::OpenGEX::OpenGEXImporter::pushNode(aiNode *, aiScene *)");
    }
    node->mParent = paVar4;
    p_Var1 = &(this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->m_nodeChildMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[*(aiNode **)(p_Var5 + 1) < paVar4])
    {
      if (*(aiNode **)(p_Var5 + 1) >= paVar4) {
        p_Var7 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
       (p_Var5 = p_Var7, paVar4 < *(aiNode **)(p_Var7 + 1))) {
      p_Var5 = &p_Var1->_M_header;
    }
    if (p_Var1 == (_Rb_tree_header *)p_Var5) {
      p_Var5 = (_Base_ptr)operator_new(0x18);
      p_Var5->_M_parent = p_Var5;
      *(_Base_ptr *)p_Var5 = p_Var5;
      p_Var5->_M_left = (_Base_ptr)0x0;
      local_30 = p_Var5;
      this_00 = (default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo> *)
                std::
                map<aiNode_*,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>,_std::less<aiNode_*>,_std::allocator<std::pair<aiNode_*const,_std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::ChildInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>_>_>_>_>
                ::operator[](&this->m_nodeChildMap,&node->mParent);
LAB_0047d84c:
      p_Var7 = local_30;
      local_30 = (_Base_ptr)0x0;
      __ptr = *(ChildInfo **)this_00;
      *(_Base_ptr *)this_00 = p_Var7;
      if (__ptr != (ChildInfo *)0x0) {
        std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>::operator()(this_00,__ptr);
      }
      if (local_30 != (_Base_ptr)0x0) {
        std::default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo>::operator()
                  ((default_delete<Assimp::OpenGEX::OpenGEXImporter::ChildInfo> *)&local_30,
                   (ChildInfo *)local_30);
      }
      goto LAB_0047d881;
    }
  }
  p_Var5 = p_Var5[1]._M_parent;
LAB_0047d881:
  p_Var6 = (_List_node_base *)operator_new(0x18);
  p_Var6[1]._M_next = (_List_node_base *)local_28;
  std::__detail::_List_node_base::_M_hook(p_Var6);
  p_Var5->_M_left = (_Base_ptr)((long)&p_Var5->_M_left->_M_color + 1);
  __position._M_current =
       (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiNode*,std::allocator<aiNode*>>::_M_realloc_insert<aiNode*const&>
              ((vector<aiNode*,std::allocator<aiNode*>> *)&this->m_nodeStack,__position,&local_28);
  }
  else {
    *__position._M_current = local_28;
    pppaVar2 = &(this->m_nodeStack).super__Vector_base<aiNode_*,_std::allocator<aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppaVar2 = *pppaVar2 + 1;
  }
  return;
}

Assistant:

void OpenGEXImporter::pushNode( aiNode *node, aiScene *pScene ) {
    ai_assert( nullptr != pScene );

    if ( nullptr == node ) {
        return;
    }

    ChildInfo *info( nullptr );
    if( m_nodeStack.empty() ) {
        node->mParent = pScene->mRootNode;
        NodeChildMap::iterator it( m_nodeChildMap.find( node->mParent ) );
        if( m_nodeChildMap.end() == it ) {
            info = new ChildInfo;
            m_root = info;
            m_nodeChildMap[ node->mParent ] = std::unique_ptr<ChildInfo>(info);
        } else {
            info = it->second.get();
        }
        info->m_children.push_back( node );
    } else {
        aiNode *parent( m_nodeStack.back() );
        ai_assert( nullptr != parent );
        node->mParent = parent;
        NodeChildMap::iterator it( m_nodeChildMap.find( node->mParent ) );
        if( m_nodeChildMap.end() == it ) {
            info = new ChildInfo;
            m_nodeChildMap[ node->mParent ] = std::unique_ptr<ChildInfo>(info);
        } else {
            info = it->second.get();
        }
        info->m_children.push_back( node );
    }
    m_nodeStack.push_back( node );
}